

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hlslParseHelper.cpp
# Opt level: O3

int __thiscall
glslang::HlslParseContext::flatten
          (HlslParseContext *this,TVariable *variable,TType *type,TFlattenData *flattenData,
          TString *name,bool linkage,TQualifier *outerQualifier,TArraySizes *builtInArraySizes)

{
  pointer pcVar1;
  int iVar2;
  TString local_80;
  TString local_58;
  
  iVar2 = (*type->_vptr_TType[0x1d])(type);
  if ((char)iVar2 == '\0') {
    iVar2 = (*type->_vptr_TType[0x25])(type);
    if ((char)iVar2 == '\0') {
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/glslang/HLSL/hlslParseHelper.cpp"
                    ,0x4d0,
                    "int glslang::HlslParseContext::flatten(const TVariable &, const TType &, TFlattenData &, TString, bool, const TQualifier &, const TArraySizes *)"
                   );
    }
    local_80._M_dataplus.super_allocator_type.allocator = GetThreadPoolAllocator();
    pcVar1 = (name->_M_dataplus)._M_p;
    local_80._M_dataplus._M_p = (pointer)&local_80.field_2;
    std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>::
    _M_construct<char*>((basic_string<char,std::char_traits<char>,glslang::std::allocator<char>> *)
                        &local_80,pcVar1,pcVar1 + name->_M_string_length);
    iVar2 = flattenStruct(this,variable,type,flattenData,&local_80,linkage,outerQualifier,
                          builtInArraySizes);
  }
  else {
    local_58._M_dataplus.super_allocator_type.allocator = GetThreadPoolAllocator();
    local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
    pcVar1 = (name->_M_dataplus)._M_p;
    std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>::
    _M_construct<char*>((basic_string<char,std::char_traits<char>,glslang::std::allocator<char>> *)
                        &local_58,pcVar1,pcVar1 + name->_M_string_length);
    iVar2 = flattenArray(this,variable,type,flattenData,&local_58,linkage,outerQualifier);
  }
  return iVar2;
}

Assistant:

int HlslParseContext::flatten(const TVariable& variable, const TType& type,
                              TFlattenData& flattenData, TString name, bool linkage,
                              const TQualifier& outerQualifier,
                              const TArraySizes* builtInArraySizes)
{
    // If something is an arrayed struct, the array flattener will recursively call flatten()
    // to then flatten the struct, so this is an "if else": we don't do both.
    if (type.isArray())
        return flattenArray(variable, type, flattenData, name, linkage, outerQualifier);
    else if (type.isStruct())
        return flattenStruct(variable, type, flattenData, name, linkage, outerQualifier, builtInArraySizes);
    else {
        assert(0); // should never happen
        return -1;
    }
}